

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

void lyd_keyless_list_hash_change(lyd_node *parent)

{
  lys_node *plVar1;
  hash_table *phVar2;
  int iVar3;
  lyd_node *local_18;
  
  if (parent != (lyd_node *)0x0) {
    local_18 = parent;
    do {
      plVar1 = local_18->schema;
      if ((plVar1->flags & 1) != 0) {
        return;
      }
      if (plVar1->nodetype == LYS_LIST) {
        if ((local_18->hash == 0) || (plVar1->padding[2] != '\0')) {
          iVar3 = lyd_list_has_keys(local_18);
          if (iVar3 == 0) {
            return;
          }
        }
        else {
          if (((local_18->parent != (lyd_node *)0x0) &&
              (phVar2 = local_18->parent->ht, phVar2 != (hash_table *)0x0)) &&
             (iVar3 = lyht_remove(phVar2,&local_18,local_18->hash), iVar3 != 0)) {
            __assert_fail("!r",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                          ,0x187,"void lyd_keyless_list_hash_change(struct lyd_node *)");
          }
          lyd_hash(local_18);
          if (((local_18->parent != (lyd_node *)0x0) &&
              (phVar2 = local_18->parent->ht, phVar2 != (hash_table *)0x0)) &&
             (iVar3 = lyht_insert(phVar2,&local_18,local_18->hash,(void **)0x0), iVar3 != 0)) {
            __assert_fail("!r",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                          ,399,"void lyd_keyless_list_hash_change(struct lyd_node *)");
          }
        }
      }
      local_18 = local_18->parent;
    } while (local_18 != (lyd_node *)0x0);
  }
  return;
}

Assistant:

static void
lyd_keyless_list_hash_change(struct lyd_node *parent)
{
    int r;

    while (parent && !(parent->schema->flags & LYS_CONFIG_W)) {
        if (parent->schema->nodetype == LYS_LIST) {
            if (parent->hash && !((struct lys_node_list *)parent->schema)->keys_size) {
                if (parent->parent && parent->parent->ht) {
                    /* remove the list from the parent */
                    r = lyht_remove(parent->parent->ht, &parent, parent->hash);
                    assert(!r);
                    (void)r;
                }
                /* recalculate the hash */
                lyd_hash(parent);
                if (parent->parent && parent->parent->ht) {
                    /* re-add the list again */
                    r = lyht_insert(parent->parent->ht, &parent, parent->hash, NULL);
                    assert(!r);
                    (void)r;
                }
            } else if (!lyd_list_has_keys(parent)) {
                /* a parent is a list without keys so it cannot be a part of any parent hash */
                break;
            }
        }

        parent = parent->parent;
    }
}